

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

void EthBasePort::PrintStatus(ostream *debugStream,uint32_t status)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  uint port;
  long lVar7;
  bool bVar8;
  
  uVar3 = BoardIO::GetFpgaVersionMajorFromStatus(status);
  std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Status: ",8);
  if (uVar3 == 1) {
    pcVar6 = "No Ethernet present";
    lVar7 = 0x13;
  }
  else {
    if (uVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Unknown FPGA, status = ",0x17)
      ;
      *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) =
           *(uint *)(debugStream + *(long *)(*(long *)debugStream + -0x18) + 0x18) & 0xffffffb5 | 8;
      debugStream = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
      lVar7 = *(long *)debugStream;
      *(uint *)(debugStream + *(long *)(lVar7 + -0x18) + 0x18) =
           *(uint *)(debugStream + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffffb5 | 2;
      goto LAB_00117b85;
    }
    if (uVar3 == 2) {
      if ((status >> 0x1e & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(debugStream,"error ",6);
      }
      if ((status >> 0x1d & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(debugStream,"initOK ",7);
      }
    }
    if ((status >> 0x1c & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"FrameErr ",9);
    }
    if ((status >> 0x1b & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"IPv4Err ",8);
    }
    if ((status >> 0x1a & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"UDPErr ",7);
    }
    if ((status >> 0x19 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"DestErr ",8);
    }
    if ((status >> 0x18 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"AccessErr ",10);
    }
    if ((status >> 0x17 & 1) == 0 || uVar3 != 2) {
      bVar8 = uVar3 != 3;
      if ((status >> 0x17 & 1) != 0 && !bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Clk125 ",7);
        bVar8 = false;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"StateErr ",9);
      bVar8 = true;
    }
    if ((status >> 0x16 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"EthStateErr ",0xc);
    }
    if ((status >> 0x15 & 1) != 0 && !bVar8) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Clk200 ",7);
    }
    if ((status >> 0x14 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"UDP ",4);
    }
    if (uVar3 != 2) {
      if ((status >> 0x10 & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(debugStream,"PS-Eth ",7);
      }
      cVar1 = (char)debugStream;
      std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      lVar7 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Port ",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)debugStream);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        bVar2 = FpgaIO::GetEthernetPortStatusV3(status,(uint)lVar7);
        if ((char)bVar2 < '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"initOK ",7);
        }
        if ((bVar2 & 0x40) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"hasIRQ ",7);
        }
        if ((bVar2 & 0x20) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Link-Off ",9);
          switch(bVar2 >> 3 & 3) {
          case 0:
switchD_001179fe_caseD_0:
            lVar5 = 8;
            pcVar6 = "10 Mbps ";
            break;
          case 1:
switchD_001179fe_caseD_1:
            lVar5 = 9;
            pcVar6 = "100 Mbps ";
            break;
          case 2:
switchD_001179fe_caseD_2:
            lVar5 = 10;
            pcVar6 = "1000 Mbps ";
            break;
          case 3:
            goto switchD_001179fe_caseD_3;
          }
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,pcVar6,lVar5);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"Link-On ",8);
          switch(bVar2 >> 3 & 3) {
          case 0:
            goto switchD_001179fe_caseD_0;
          case 1:
            goto switchD_001179fe_caseD_1;
          case 2:
            goto switchD_001179fe_caseD_2;
          }
        }
switchD_001179fe_caseD_3:
        if ((bVar2 & 4) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"RecvErr ",8);
        }
        if ((bVar2 & 2) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"SendOvf ",8);
        }
        if ((bVar2 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(debugStream,"PS-Eth ",7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)debugStream + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        lVar7 = lVar7 + 1;
        if (lVar7 == 3) {
          return;
        }
      } while( true );
    }
    if ((status >> 0x13 & 1) == 0) {
      pcVar6 = "Link-Off ";
      lVar7 = 9;
    }
    else {
      pcVar6 = "Link-On ";
      lVar7 = 8;
    }
    std::__ostream_insert<char,std::char_traits<char>>(debugStream,pcVar6,lVar7);
    if ((status >> 0x12 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(debugStream,"ETH-idle ",9);
    }
    switch(status >> 0x10 & 3) {
    case 0:
      pcVar6 = "wait-none";
      break;
    case 1:
      pcVar6 = "wait-recv";
      break;
    case 2:
      pcVar6 = "wait-send";
      break;
    case 3:
      pcVar6 = "wait-flush";
      lVar7 = 10;
      goto LAB_00117b76;
    }
    lVar7 = 9;
  }
LAB_00117b76:
  std::__ostream_insert<char,std::char_traits<char>>(debugStream,pcVar6,lVar7);
  lVar7 = *(long *)debugStream;
LAB_00117b85:
  std::ios::widen((char)*(undefined8 *)(lVar7 + -0x18) + (char)debugStream);
  std::ostream::put((char)debugStream);
  std::ostream::flush();
  return;
}

Assistant:

void EthBasePort::PrintStatus(std::ostream &debugStream, uint32_t status)
{
    unsigned int ver = BoardIO::GetFpgaVersionMajorFromStatus(status);
    debugStream << "Status: ";
    if (ver == 0) {
        debugStream << "Unknown FPGA, status = " << std::hex << status << std::dec << std::endl;
    }
    else if (ver == 1) {
        // FPGA V1
        debugStream << "No Ethernet present" << std::endl;
    }
    else {
        // FPGA V2 or V3
        if (ver == 2) {
            if (status&FpgaIO::ETH_STAT_REQ_ERR_V2) debugStream << "error ";
            if (status&FpgaIO::ETH_STAT_INIT_OK_V2) debugStream << "initOK ";
        }
        if (status & FpgaIO::ETH_STAT_FRAME_ERR)    debugStream << "FrameErr ";
        if (status & FpgaIO::ETH_STAT_IPV4_ERR)     debugStream << "IPv4Err ";
        if (status & FpgaIO::ETH_STAT_UDP_ERR)      debugStream << "UDPErr ";
        if (status & FpgaIO::ETH_STAT_DEST_ERR)     debugStream << "DestErr ";
        if (status & FpgaIO::ETH_STAT_ACCESS_ERR)   debugStream << "AccessErr ";
        if ((ver == 2) && (status & FpgaIO::ETH_STAT_STATE_ERR_V2)) debugStream << "StateErr ";
        if ((ver == 3) && (status & FpgaIO::ETH_STAT_CLK125_OK_V3)) debugStream << "Clk125 ";
        if (status & FpgaIO::ETH_STAT_ETHST_ERR )   debugStream << "EthStateErr ";
        if ((ver == 3) && (status & FpgaIO::ETH_STAT_CLK200_OK_V3)) debugStream << "Clk200 ";
        if (status & FpgaIO::ETH_STAT_UDP)          debugStream << "UDP ";
        if (ver == 2) {
            if (status & FpgaIO::ETH_STAT_LINK_STAT_V2) debugStream << "Link-On ";
            else                                        debugStream << "Link-Off ";
            if (status & FpgaIO::ETH_STAT_IDLE_V2)  debugStream << "ETH-idle ";
            int waitInfo = (status & FpgaIO::ETH_STAT_WAIT_MASK_V2)>>16;
            if (waitInfo == 0) debugStream << "wait-none";
            else if (waitInfo == 1) debugStream << "wait-recv";
            else if (waitInfo == 2) debugStream << "wait-send";
            else debugStream << "wait-flush";
            debugStream << std::endl;
        }
        else {   // ver == 3
            // Following bit introduced in Firmware Rev 9, but was previously 0
            if (status & FpgaIO::ETH_STAT_PSETH_EN_V3) debugStream << "PS-Eth ";
            debugStream << std::endl;
            for (unsigned int port = 1; port <= 2; port++) {
                debugStream << "Port " << port << ": ";
                uint8_t portStatus = FpgaIO::GetEthernetPortStatusV3(status, port);
                if (portStatus & FpgaIO::ETH_PORT_STAT_INIT_OK)   debugStream << "initOK ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_HAS_IRQ)   debugStream << "hasIRQ ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_LINK_STAT) debugStream << "Link-On ";
                else                                              debugStream << "Link-Off ";
                uint8_t linkSpeed = (portStatus & FpgaIO::ETH_PORT_STAT_SPEED_MASK)>>3;
                if (linkSpeed == 0)                               debugStream << "10 Mbps ";
                else if (linkSpeed == 1)                          debugStream << "100 Mbps ";
                else if (linkSpeed == 2)                          debugStream << "1000 Mbps ";
                // Following are only for Firmware Rev 8
                if (portStatus & FpgaIO::ETH_PORT_STAT_RECV_ERR)  debugStream << "RecvErr ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_SEND_OVF)  debugStream << "SendOvf ";
                if (portStatus & FpgaIO::ETH_PORT_STAT_PS_ETH)    debugStream << "PS-Eth ";
                debugStream << std::endl;
            }
        }
    }
}